

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O0

void AssertParse(State *state,char *input,ManifestParserOptions opts)

{
  Test *pTVar1;
  undefined8 __s;
  bool bVar2;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string err;
  undefined1 local_80 [8];
  ManifestParser parser;
  char *input_local;
  State *state_local;
  ManifestParserOptions opts_local;
  
  err.field_2._8_8_ = opts;
  parser._88_8_ = input;
  ManifestParser::ManifestParser((ManifestParser *)local_80,state,(FileReader *)0x0,opts);
  std::__cxx11::string::string((string *)local_a8);
  __s = parser._88_8_;
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,(char *)__s,&local_c9);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_80,&local_c8,(string *)local_a8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/test.cc",
             0x68,"parser.ParseTest(input, &err)");
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a8);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/test.cc"
                     ,0x69,"\"\" == err");
  if (bVar2) {
    VerifyGraph(state);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_a8);
  return;
}

Assistant:

void AssertParse(State* state, const char* input,
                 ManifestParserOptions opts) {
  ManifestParser parser(state, NULL, opts);
  string err;
  EXPECT_TRUE(parser.ParseTest(input, &err));
  ASSERT_EQ("", err);
  VerifyGraph(*state);
}